

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall kratos::IfStmt::clear(IfStmt *this)

{
  (*(((this->predicate_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->super_Stmt).super_IRNode._vptr_IRNode[0xc])();
  (*(((this->then_body_).super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xc])();
  (*(((this->else_body_).super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xc])();
  return;
}

Assistant:

void IfStmt::clear() {
    predicate_stmt_->clear();
    then_body_->clear();
    else_body_->clear();
}